

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

void __thiscall docopt::value::~value(value *this)

{
  Kind KVar1;
  value *this_local;
  
  KVar1 = this->kind;
  if (Long < KVar1) {
    if (KVar1 == String) {
      std::__cxx11::string::~string((string *)&(this->variant).strValue);
    }
    else if (KVar1 == StringList) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&(this->variant).strList);
    }
  }
  Variant::~Variant((Variant *)&(this->variant).strValue);
  return;
}

Assistant:

inline
	value::~value()
	{
		switch (kind) {
			case Kind::String:
				variant.strValue.~basic_string();
				break;

			case Kind::StringList:
				variant.strList.~vector();
				break;

			case Kind::Empty:
			case Kind::Bool:
			case Kind::Long:
			default:
				// trivial dtor
				break;
		}
	}